

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int async_sign_certificate
              (ptls_sign_certificate_t *self,ptls_t *tls,ptls_async_job_t **async,
              uint16_t *selected_algorithm,ptls_buffer_t *output,ptls_iovec_t input,
              uint16_t *algorithms,size_t num_algorithms)

{
  int iVar1;
  undefined1 local_60 [4];
  int ret;
  ptls_buffer_t fakebuf;
  uint16_t *algorithms_local;
  ptls_buffer_t *output_local;
  uint16_t *selected_algorithm_local;
  ptls_async_job_t **async_local;
  ptls_t *tls_local;
  ptls_sign_certificate_t *self_local;
  
  fakebuf._24_8_ = algorithms;
  if (async != (ptls_async_job_t **)0x0) {
    if (*async == (ptls_async_job_t *)0x0) {
      ptls_buffer_init((ptls_buffer_t *)local_60,"",0);
      iVar1 = sign_certificate(self,tls,(ptls_async_job_t **)0x0,selected_algorithm,
                               (ptls_buffer_t *)local_60,input,(uint16_t *)fakebuf._24_8_,
                               num_algorithms);
      if (iVar1 == 0) {
        ptls_buffer_dispose((ptls_buffer_t *)local_60);
        async_sign_certificate::async_ctx.super.destroy_ =
             (_func_void_st_ptls_async_job_t_ptr *)0xdeadbeef;
        async_sign_certificate::async_ctx.selected_algorithm = *selected_algorithm;
        *async = &async_sign_certificate::async_ctx.super;
        server_sc_callcnt = server_sc_callcnt - 1;
        async_sc_callcnt = async_sc_callcnt + 1;
        return 0x20b;
      }
      __assert_fail("ret == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",
                    0x4c9,
                    "int async_sign_certificate(ptls_sign_certificate_t *, ptls_t *, ptls_async_job_t **, uint16_t *, ptls_buffer_t *, ptls_iovec_t, const uint16_t *, size_t)"
                   );
    }
    if ((anon_struct_32_2_0637b3a8 *)*async != &async_sign_certificate::async_ctx) {
      __assert_fail("*async == &async_ctx.super",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",
                    0x4d3,
                    "int async_sign_certificate(ptls_sign_certificate_t *, ptls_t *, ptls_async_job_t **, uint16_t *, ptls_buffer_t *, ptls_iovec_t, const uint16_t *, size_t)"
                   );
    }
    if (algorithms != (uint16_t *)0x0) {
      __assert_fail("algorithms == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",
                    0x4d4,
                    "int async_sign_certificate(ptls_sign_certificate_t *, ptls_t *, ptls_async_job_t **, uint16_t *, ptls_buffer_t *, ptls_iovec_t, const uint16_t *, size_t)"
                   );
    }
    fakebuf.is_allocated = 0x88;
    fakebuf.align_bits = 0xf6;
    fakebuf._26_6_ = 0x16;
    num_algorithms = 1;
    *async = (ptls_async_job_t *)0x0;
  }
  iVar1 = sign_certificate(self,tls,(ptls_async_job_t **)0x0,selected_algorithm,output,input,
                           (uint16_t *)fakebuf._24_8_,num_algorithms);
  return iVar1;
}

Assistant:

static int async_sign_certificate(ptls_sign_certificate_t *self, ptls_t *tls, ptls_async_job_t **async,
                                  uint16_t *selected_algorithm, ptls_buffer_t *output, ptls_iovec_t input,
                                  const uint16_t *algorithms, size_t num_algorithms)
{
    static struct {
        ptls_async_job_t super;
        uint16_t selected_algorithm;
    } async_ctx;

    if (async != NULL) {
        if (*async == NULL) {
            /* first invocation, make a fake call to the backend and obtain the algorithm, return it, but not the signature */
            ptls_buffer_t fakebuf;
            ptls_buffer_init(&fakebuf, "", 0);
            int ret = sign_certificate(self, tls, NULL, selected_algorithm, &fakebuf, input, algorithms, num_algorithms);
            assert(ret == 0);
            ptls_buffer_dispose(&fakebuf);
            async_ctx.super.destroy_ = (void (*)(ptls_async_job_t *))0xdeadbeef;
            async_ctx.selected_algorithm = *selected_algorithm;
            *async = &async_ctx.super;
            --server_sc_callcnt;
            ++async_sc_callcnt;
            return PTLS_ERROR_ASYNC_OPERATION;
        } else {
            /* second invocation, restore algorithm, and delegate the call */
            assert(*async == &async_ctx.super);
            assert(algorithms == NULL);
            algorithms = &async_ctx.selected_algorithm;
            num_algorithms = 1;
            *async = NULL;
        }
    }

    return sign_certificate(self, tls, NULL, selected_algorithm, output, input, algorithms, num_algorithms);
}